

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 150_evaluateReversePolishNums.cpp
# Opt level: O1

int main(void)

{
  iterator __position;
  void *pvVar1;
  int iVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> adj [8258];
  long alStack_120 [2];
  int local_10c;
  vector<int,std::allocator<int>> local_108 [8];
  undefined8 local_100 [30];
  
  alStack_120[0] = 0x101258;
  memset(local_108,0,0xf0);
  local_10c = 0;
  do {
    lVar3 = (long)local_10c;
    __position._M_current = (int *)local_100[lVar3 * 3];
    if (__position._M_current == (int *)local_100[lVar3 * 3 + 1]) {
      alStack_120[0] = 0x101290;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (local_108 + lVar3 * 0x18,__position,&local_10c);
    }
    else {
      *__position._M_current = local_10c;
      local_100[lVar3 * 3] = __position._M_current + 1;
    }
    iVar2 = local_10c;
    local_10c = local_10c + 1;
  } while (iVar2 < 9);
  lVar3 = 0xf0;
  do {
    pvVar1 = *(void **)((long)alStack_120 + lVar3);
    if (pvVar1 != (void *)0x0) {
      alStack_120[0] = 0x1012bc;
      operator_delete(pvVar1,*(long *)(&stack0xfffffffffffffef0 + lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  return 0;
}

Assistant:

int main()
{
	// string s1 = "+";
	// if (s1=="+")
	// 	cout<<"TTT"<<endl;
	// vector<string> v = {"9","10","2"};
	// sort(v.begin(),v.end());
	// for (auto s : v)
	// 	cout<<s;
	int n = 10;
	vector<int> adj[n];
	for (int i=0;i<n;i++)
	{
		adj[i].push_back(i);
	}

	// cout<<stoi(s1)<<endl;
}